

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

char * __thiscall
MemoryLeakDetector::reallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  MemoryLeakFailure *reporter;
  uint uVar1;
  TestMemoryAllocator *allocAllocator;
  char *pcVar2;
  MemoryLeakDetectorNode *pMVar3;
  MemoryLeakDetectorNode *node;
  MemoryLeakDetectorNode *pMVar4;
  
  if (memory == (char *)0x0) {
    pcVar2 = reallocateMemoryAndLeakInformation
                       (this,allocator,(char *)0x0,size,file,line,allocatNodesSeperately);
  }
  else {
    uVar1 = (int)memory + (int)((ulong)memory / 0x49) * -0x49;
    node = (this->memoryTable_).table_[uVar1].head_;
    if (node != (MemoryLeakDetectorNode *)0x0) {
      if (*(char **)(node + 0x10) == memory) {
        pMVar3 = (MemoryLeakDetectorNode *)0x0;
      }
      else {
        do {
          pMVar3 = node;
          node = *(MemoryLeakDetectorNode **)(pMVar3 + 0x38);
          if (node == (MemoryLeakDetectorNode *)0x0) goto LAB_0013ca59;
        } while (*(char **)(node + 0x10) != memory);
      }
      pMVar4 = pMVar3 + 0x38;
      if (pMVar3 == (MemoryLeakDetectorNode *)0x0) {
        pMVar4 = (MemoryLeakDetectorNode *)((this->memoryTable_).table_ + uVar1);
      }
      *(undefined8 *)pMVar4 = *(undefined8 *)(node + 0x38);
      checkForCorruption(this,node,file,line,allocator,allocatNodesSeperately);
      pcVar2 = reallocateMemoryAndLeakInformation
                         (this,allocator,memory,size,file,line,allocatNodesSeperately);
      return pcVar2;
    }
LAB_0013ca59:
    reporter = this->reporter_;
    allocAllocator = NullUnknownAllocator::defaultAllocator();
    MemoryLeakOutputStringBuffer::reportFailure
              (&this->outputBuffer_,"Deallocating non-allocated memory\n","<unknown>",0,0,
               allocAllocator,file,line,allocator,reporter);
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char* MemoryLeakDetector::reallocMemory(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (memory) {
        MemoryLeakDetectorNode* node = memoryTable_.removeNode(memory);
        if (node == NULLPTR) {
            outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
            return NULLPTR;
        }
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
    }
    return reallocateMemoryAndLeakInformation(allocator, memory, size, file, line, allocatNodesSeperately);
}